

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int walIndexPageRealloc(Wal *pWal,int iPage,u32 **ppPage)

{
  int iVar1;
  u32 **ppuVar2;
  u32 *__s;
  int iVar3;
  long lVar4;
  
  lVar4 = (long)iPage;
  if (pWal->nWiData <= iPage) {
    ppuVar2 = pWal->apWiData;
    iVar1 = sqlite3_initialize();
    iVar3 = (int)(lVar4 + 1);
    if (iVar1 == 0) {
      ppuVar2 = (u32 **)sqlite3Realloc(ppuVar2,(long)iVar3 << 3);
    }
    else {
      ppuVar2 = (u32 **)0x0;
    }
    if (ppuVar2 == (u32 **)0x0) {
      *ppPage = (u32 *)0x0;
      return 7;
    }
    memset(ppuVar2 + pWal->nWiData,0,((lVar4 + 1) - (long)pWal->nWiData) * 8);
    pWal->apWiData = ppuVar2;
    pWal->nWiData = iVar3;
  }
  if (pWal->exclusiveMode == '\x02') {
    __s = (u32 *)sqlite3Malloc(0x8000);
    if (__s != (u32 *)0x0) {
      memset(__s,0,0x8000);
    }
    pWal->apWiData[lVar4] = __s;
    iVar1 = 7;
    if (pWal->apWiData[lVar4] != (u32 *)0x0) {
      iVar1 = 0;
    }
  }
  else {
    iVar1 = (*pWal->pDbFd->pMethods->xShmMap)
                      (pWal->pDbFd,iPage,0x8000,(int)pWal->writeLock,pWal->apWiData + lVar4);
    if ((char)iVar1 == '\b') {
      pWal->readOnly = pWal->readOnly | 2;
      if (iVar1 == 8) {
        iVar1 = 0;
      }
    }
  }
  *ppPage = pWal->apWiData[lVar4];
  return iVar1;
}

Assistant:

static SQLITE_NOINLINE int walIndexPageRealloc(
  Wal *pWal,               /* The WAL context */
  int iPage,               /* The page we seek */
  volatile u32 **ppPage    /* Write the page pointer here */
){
  int rc = SQLITE_OK;

  /* Enlarge the pWal->apWiData[] array if required */
  if( pWal->nWiData<=iPage ){
    sqlite3_int64 nByte = sizeof(u32*)*(iPage+1);
    volatile u32 **apNew;
    apNew = (volatile u32 **)sqlite3_realloc64((void *)pWal->apWiData, nByte);
    if( !apNew ){
      *ppPage = 0;
      return SQLITE_NOMEM_BKPT;
    }
    memset((void*)&apNew[pWal->nWiData], 0,
           sizeof(u32*)*(iPage+1-pWal->nWiData));
    pWal->apWiData = apNew;
    pWal->nWiData = iPage+1;
  }

  /* Request a pointer to the required page from the VFS */
  assert( pWal->apWiData[iPage]==0 );
  if( pWal->exclusiveMode==WAL_HEAPMEMORY_MODE ){
    pWal->apWiData[iPage] = (u32 volatile *)sqlite3MallocZero(WALINDEX_PGSZ);
    if( !pWal->apWiData[iPage] ) rc = SQLITE_NOMEM_BKPT;
  }else{
    rc = sqlite3OsShmMap(pWal->pDbFd, iPage, WALINDEX_PGSZ, 
        pWal->writeLock, (void volatile **)&pWal->apWiData[iPage]
    );
    assert( pWal->apWiData[iPage]!=0 || rc!=SQLITE_OK || pWal->writeLock==0 );
    testcase( pWal->apWiData[iPage]==0 && rc==SQLITE_OK );
    if( (rc&0xff)==SQLITE_READONLY ){
      pWal->readOnly |= WAL_SHM_RDONLY;
      if( rc==SQLITE_READONLY ){
        rc = SQLITE_OK;
      }
    }
  }

  *ppPage = pWal->apWiData[iPage];
  assert( iPage==0 || *ppPage || rc!=SQLITE_OK );
  return rc;
}